

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

int __thiscall PFData::loadPQR(PFData *this)

{
  int *in_RDI;
  int err;
  int nz;
  int ny;
  int nx;
  int i;
  int xDim;
  int yDim;
  fpos_t pos;
  anon_class_1_0_00000001 readValues;
  int *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int iVar1;
  int local_30;
  int local_2c;
  fpos_t local_28 [2];
  
  memset(local_28,0,0x10);
  fgetpos(*(FILE **)(in_RDI + 8),local_28);
  fseek(*(FILE **)(in_RDI + 8),0x4c,0);
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  local_2c = 0;
  local_30 = 0;
  iVar1 = 0;
  while( true ) {
    if (in_RDI[0x1a] <= iVar1) {
      fsetpos(*(FILE **)(in_RDI + 8),local_28);
      return 0;
    }
    in_stack_ffffffffffffffbc =
         loadPQR::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                    (FILE *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,
                    in_stack_ffffffffffffffa8);
    if (in_stack_ffffffffffffffbc != 0) break;
    local_30 = in_stack_ffffffffffffffc8 + local_30;
    if (in_RDI[0x1c] == 0) {
      in_RDI[0x1d] = in_RDI[0x1d] + 1;
    }
    if (local_30 == in_RDI[0x12]) {
      local_2c = in_stack_ffffffffffffffc4 + local_2c;
      in_RDI[0x1c] = in_RDI[0x1c] + 1;
      local_30 = 0;
    }
    if (local_2c == in_RDI[0x11]) {
      in_RDI[0x1b] = in_RDI[0x1b] + 1;
      local_2c = 0;
    }
    if (iVar1 != in_RDI[0x1a] + -1) {
      fseek(*(FILE **)(in_RDI + 8),
            (long)(in_stack_ffffffffffffffc8 * 8 * in_stack_ffffffffffffffc4 *
                   in_stack_ffffffffffffffc0 + 0x18),1);
    }
    iVar1 = iVar1 + 1;
  }
  fsetpos(*(FILE **)(in_RDI + 8),local_28);
  return in_stack_ffffffffffffffbc;
}

Assistant:

int PFData::loadPQR(){
    //Read nx, ny, nz from subgrid header.
    auto readValues = [](std::FILE* f, int& nx, int& ny, int& nz){
        int err = std::fread(&nx, 4, 1, f);
        if(err != 1){
            perror("Error reading nx in subgrid header");
            return err;
        }

        err = std::fread(&ny, 4, 1, f);
        if(err != 1){
            perror("Error reading ny in subgrid header");
            return err;
        }

        err = std::fread(&nz, 4, 1, f);
        if(err != 1){
            perror("Error reading nz in subgrid header");
            return err;
        }

        nx = bswap32(nx);
        ny = bswap32(ny);
        nz = bswap32(nz);

        return 0;
    };


    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);
    std::fseek(m_fp, 64+12, SEEK_SET); //Skip file header and first 3 ints of the subgrid header.

    //Reset
    m_r = 0;
    m_q = 0;
    m_p = 0;

    int yDim{};
    int xDim{};


    //Each iter:
    //  if m_q == 0, m_p++
    //  Every time xDim == m_nx, add 1 to m_q
    //  Every time yDim == m_ny, add 1 to m_r

    for(int i = 0; i < m_numSubgrids; ++i){
        int nx, ny, nz;
        if(int err = readValues(m_fp, nx, ny, nz)){
            std::fsetpos(m_fp, &pos);
            return err;
        }

        xDim += nx;

        if(m_q == 0){
            m_p++;
        }

        if(xDim == m_nx){
            yDim += ny;     //Only increase y count once per row
            m_q++;
            xDim = 0;
        }

        if(yDim == m_ny){
            m_r++;
            yDim = 0;
        }

        if(i != m_numSubgrids-1){//Avoid skipping past end of file
            //Skip the last 3 ints of the subgrid header, the data, and the first 3 ints of the next subgrid header
            std::fseek(m_fp, 12+8*nx*ny*nz+12, SEEK_CUR);
        }

    }

    //Restore old position
    std::fsetpos(m_fp, &pos);
    return 0;
}